

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool __thiscall absl::Mutex::ReaderLockWhenWithDeadline(Mutex *this,Condition *cond,Time deadline)

{
  GraphId cond_00;
  Time t;
  KernelTimeout local_40;
  byte local_31;
  GraphId GStack_30;
  bool res;
  GraphId id;
  Condition *cond_local;
  Mutex *this_local;
  Time deadline_local;
  
  id.handle = (uint64_t)cond;
  GStack_30 = DebugOnlyDeadlockCheck(this);
  cond_00.handle = id.handle;
  t.rep_._12_4_ = 0;
  t.rep_.rep_hi_ = SUB128(deadline.rep_._0_12_,0);
  t.rep_.rep_lo_ = SUB124(deadline.rep_._0_12_,8);
  synchronization_internal::KernelTimeout::KernelTimeout(&local_40,t);
  local_31 = LockSlowWithDeadline(this,(MuHow)kSharedS,(Condition *)cond_00.handle,local_40,0);
  DebugOnlyLockEnter(this,GStack_30);
  return (bool)(local_31 & 1);
}

Assistant:

bool Mutex::ReaderLockWhenWithDeadline(const Condition &cond,
                                       absl::Time deadline) {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, __tsan_mutex_read_lock);
  GraphId id = DebugOnlyDeadlockCheck(this);
  bool res = LockSlowWithDeadline(kShared, &cond, KernelTimeout(deadline), 0);
  DebugOnlyLockEnter(this, id);
  ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_read_lock, 0);
  return res;
}